

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall duckdb_re2::Compiler::Capture(Compiler *this,Frag a,int n)

{
  Frag FVar1;
  bool bVar2;
  uint32_t uVar3;
  PatchList PVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Inst *in_RDI;
  Frag FVar5;
  int id;
  uint32_t in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Inst *in_stack_ffffffffffffff88;
  Frag local_68;
  Frag local_50;
  int n_00;
  uint32_t uVar6;
  undefined4 uStack_30;
  uint32_t uStack_1c;
  uint32_t local_18;
  byte bStack_14;
  Frag local_10;
  
  uStack_1c = (uint32_t)((ulong)in_RSI >> 0x20);
  local_18 = (uint32_t)in_RDX;
  n_00 = (int)in_RSI;
  uStack_30 = (undefined4)((ulong)in_RDX >> 0x20);
  FVar5.end.tail = local_18;
  FVar5._0_8_ = in_RSI;
  FVar5._12_4_ = uStack_30;
  uVar3 = uStack_1c;
  uVar6 = local_18;
  bVar2 = IsNoMatch(FVar5);
  if (bVar2) {
    FVar5 = NoMatch((Compiler *)0x815037);
    local_50._0_8_ = FVar5._0_8_;
    local_10.begin = local_50.begin;
    local_10.end.head = local_50.end.head;
    local_50.end.tail = FVar5.end.tail;
    local_10.end.tail = local_50.end.tail;
    local_50.nullable = FVar5.nullable;
    local_10.nullable = local_50.nullable;
  }
  else {
    uVar3 = AllocInst((Compiler *)CONCAT44(uVar6,uVar3),n_00);
    if ((int)uVar3 < 0) {
      FVar5 = NoMatch((Compiler *)0x81508a);
      local_68._0_8_ = FVar5._0_8_;
      local_10.begin = local_68.begin;
      local_10.end.head = local_68.end.head;
      local_68.end.tail = FVar5.end.tail;
      local_10.end.tail = local_68.end.tail;
      local_68.nullable = FVar5.nullable;
      local_10.nullable = local_68.nullable;
    }
    else {
      PODArray<duckdb_re2::Prog::Inst>::operator[]
                ((PODArray<duckdb_re2::Prog::Inst> *)in_RDI,in_stack_ffffffffffffff7c);
      Prog::Inst::InitCapture(in_RDI,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      PODArray<duckdb_re2::Prog::Inst>::operator[]
                ((PODArray<duckdb_re2::Prog::Inst> *)in_RDI,in_stack_ffffffffffffff7c);
      Prog::Inst::InitCapture(in_RDI,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      uVar6 = (uint32_t)((ulong)in_RDI >> 0x20);
      PODArray<duckdb_re2::Prog::Inst>::data((PODArray<duckdb_re2::Prog::Inst> *)0x815113);
      PVar4.tail = local_18;
      PVar4.head = uStack_1c;
      PatchList::Patch(in_stack_ffffffffffffff88,PVar4,uVar6);
      PVar4 = PatchList::Mk((uVar3 + 1) * 2);
      bStack_14 = (byte)((ulong)in_RDX >> 0x20);
      Frag::Frag(&local_10,uVar3,PVar4,(bool)(bStack_14 & 1));
    }
  }
  FVar1.end.tail = local_10.end.tail;
  FVar1.begin = local_10.begin;
  FVar1.end.head = local_10.end.head;
  FVar1.nullable = local_10.nullable;
  FVar1._13_3_ = local_10._13_3_;
  return FVar1;
}

Assistant:

Frag Compiler::Capture(Frag a, int n) {
  if (IsNoMatch(a))
    return NoMatch();
  int id = AllocInst(2);
  if (id < 0)
    return NoMatch();
  inst_[id].InitCapture(2*n, a.begin);
  inst_[id+1].InitCapture(2*n+1, 0);
  PatchList::Patch(inst_.data(), a.end, id+1);

  return Frag(id, PatchList::Mk((id+1) << 1), a.nullable);
}